

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O1

bool crnlib::create_compressed_texture
               (crn_comp_params *params,vector<unsigned_char> *comp_data,
               uint32 *pActual_quality_level,float *pActual_bitrate)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uchar *puVar4;
  int i;
  int iVar5;
  int iVar6;
  itexture_comp *p;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined4 extraout_var_00;
  uint uVar10;
  uint uVar11;
  ulong uVar13;
  ulong uVar14;
  char *p_00;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  char cVar18;
  float bitrate;
  crn_comp_params local_params;
  float cached_bitrates [256];
  float local_7e4;
  uint local_7e0;
  float local_7dc;
  float local_7d8;
  uint local_7d4;
  uint32 *local_7d0;
  float *local_7c8;
  vector<unsigned_char> *local_7c0;
  crn_comp_params *local_7b8;
  undefined1 local_7b0 [4];
  crn_file_type local_7ac;
  long local_798;
  byte local_790;
  float local_488;
  uint local_484;
  float afStack_438 [258];
  undefined4 extraout_var;
  ulong uVar12;
  
  local_7b8 = params;
  memcpy(local_7b0,params,0x378);
  if ((local_798 - 3U < 7) && ((local_790 & 1) != 0)) {
    console::info("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");
    local_790 = local_790 & 0xfe;
  }
  if (pActual_quality_level != (uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  if (comp_data->m_size != 0) {
    comp_data->m_size = 0;
  }
  local_7d0 = pActual_quality_level;
  local_7c8 = pActual_bitrate;
  local_7c0 = comp_data;
  p = create_texture_comp(local_7ac);
  if (p == (itexture_comp *)0x0) {
    return false;
  }
  iVar5 = (*p->_vptr_itexture_comp[3])(p,local_7b0);
  if ((char)iVar5 == '\0') {
    (**p->_vptr_itexture_comp)(p);
    goto LAB_0014753c;
  }
  if (((0.0 < local_488) && (local_798 != 1)) &&
     ((local_7ac != cCRNFileTypeCRN || ((local_790 & 0x40) == 0)))) {
    local_7e4 = 1e+10;
    local_7e0 = 0xffffffff;
    do {
      lVar7 = 0;
      do {
        afStack_438[lVar7] = -1.0;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x100);
      local_7d8 = 0.0;
      uVar16 = 0xff;
      uVar14 = 0;
      local_7d4 = 0;
      bVar17 = false;
      do {
        iVar15 = (int)uVar16;
        iVar5 = (int)uVar14;
        if (iVar15 < iVar5) goto LAB_0014731f;
        if ((int)local_7b8->m_flags < 0) {
          console::debug("Quality level bracket: [%u, %u]",uVar14,uVar16);
        }
        uVar11 = (iVar15 + iVar5) / 2;
        uVar12 = (ulong)uVar11;
        uVar13 = uVar12;
        if ((local_7d4 != 0) && (!bVar17)) {
          lVar8 = (long)(int)uVar11;
          lVar7 = lVar8;
          do {
            fVar1 = afStack_438[lVar7];
            if (lVar7 < 1) break;
            lVar7 = lVar7 + -1;
          } while (fVar1 < 0.0);
          if (0.0 <= fVar1) {
            if (iVar15 + iVar5 < 0x1fe) {
              do {
                fVar2 = afStack_438[lVar8 + 1];
                if (0xfd < lVar8) break;
                lVar8 = lVar8 + 1;
              } while (fVar2 < 0.0);
              if ((((0.0 <= fVar2) && (fVar1 < fVar2)) && (fVar1 < local_488)) &&
                 (local_488 <= fVar2)) {
                iVar6 = (int)(((float)(iVar15 - iVar5) * (local_488 - fVar1)) / (fVar2 - fVar1));
                uVar10 = iVar6 + iVar5;
                if (iVar15 < (int)uVar10) {
                  uVar10 = uVar11;
                }
                uVar13 = (ulong)uVar10;
                if (iVar6 < 0) {
                  uVar13 = uVar12;
                }
              }
            }
          }
          else {
            uVar13 = (ulong)(uint)(int)(((float)iVar15 - (float)iVar5) * 0.33 + (float)iVar5);
          }
        }
        uVar11 = (uint)uVar13;
        console::info("Compressing to quality level %u",uVar13);
        local_7dc = 0.0;
        local_484 = uVar11;
        iVar5 = (*p->_vptr_itexture_comp[4])(p,local_7b0,&local_7dc);
        if ((char)iVar5 == '\0') {
          (**p->_vptr_itexture_comp)(p);
          crnlib_free(p);
          cVar18 = '\x01';
        }
        else {
          afStack_438[(int)uVar11] = local_7dc;
          if (local_7d8 <= local_7dc) {
            local_7d8 = local_7dc;
          }
          console::info("\nTried quality level %u, bpp: %3.3f",(double)local_7dc,uVar13);
          fVar1 = local_7dc;
          if ((((int)local_7e0 < 0) || ((local_7dc <= local_488 && (local_488 < local_7e4)))) ||
             (((local_7dc <= local_488 || (local_488 < local_7e4)) &&
              (ABS(local_7dc - local_488) < ABS(local_7e4 - local_488))))) {
            local_7e4 = local_7dc;
            iVar5 = (*p->_vptr_itexture_comp[7])(p);
            puVar9 = (undefined8 *)CONCAT44(extraout_var,iVar5);
            puVar4 = local_7c0->m_p;
            local_7c0->m_p = (uchar *)*puVar9;
            *puVar9 = puVar4;
            uVar3 = local_7c0->m_size;
            local_7c0->m_size = *(uint *)(puVar9 + 1);
            *(uint *)(puVar9 + 1) = uVar3;
            uVar3 = local_7c0->m_capacity;
            local_7c0->m_capacity = *(uint *)((long)puVar9 + 0xc);
            *(uint *)((long)puVar9 + 0xc) = uVar3;
            if ((int)local_7b8->m_flags < 0) {
              console::debug("Choose new best quality level");
            }
            local_7e0 = uVar11;
            if ((fVar1 <= local_488) && (cVar18 = '\b', ABS(fVar1 - local_488) < 0.005))
            goto LAB_0014730e;
          }
          uVar13 = (ulong)(uVar11 + 1);
          if (local_488 < local_7dc) {
            uVar16 = (ulong)(uVar11 - 1);
            uVar13 = uVar14;
          }
          uVar14 = uVar13;
          local_7d4 = local_7d4 + 1;
          if (8 < local_7d4) {
            bVar17 = true;
          }
          cVar18 = '\0';
        }
LAB_0014730e:
      } while (cVar18 == '\0');
      if (cVar18 == '\b') {
LAB_0014731f:
        cVar18 = '\x02';
        if ((((local_790 & 2) != 0) && (local_7d8 < local_488)) &&
           (0.005 <= ABS(local_7e4 - local_488))) {
          console::info(
                       "Unable to achieve desired bitrate - disabling adaptive block sizes and retrying search."
                       );
          local_790 = local_790 & 0xfd;
          if (p != (itexture_comp *)0x0) {
            (**p->_vptr_itexture_comp)(p);
            crnlib_free(p);
          }
          p = create_texture_comp(local_7ac);
          iVar5 = (*p->_vptr_itexture_comp[3])(p,local_7b0);
          cVar18 = (char)iVar5 == '\0';
          if ((bool)cVar18) {
            (**p->_vptr_itexture_comp)(p);
            crnlib_free(p);
          }
        }
      }
      if (cVar18 != '\0') {
        if (cVar18 != '\x02') {
          return false;
        }
        if (p != (itexture_comp *)0x0) {
          (**p->_vptr_itexture_comp)(p);
          crnlib_free(p);
        }
        if ((int)local_7e0 < 0) {
          return false;
        }
        if (local_7d0 != (uint32 *)0x0) {
          *local_7d0 = local_7e0;
        }
        if (local_7c8 != (float *)0x0) {
          *local_7c8 = local_7e4;
        }
        console::printf("Selected quality level %u bpp: %f",(double)local_7e4,(ulong)local_7e0);
        return true;
      }
    } while( true );
  }
  if ((local_7ac == cCRNFileTypeCRN) || ((local_7ac == cCRNFileTypeDDS && (local_484 < 0xff)))) {
    console::info("Compressing using quality level %i",(ulong)local_484);
  }
  if (local_798 == 1) {
    if (local_7ac == cCRNFileTypeCRN) {
      p_00 = "CRN format doesn\'t support DXT3";
    }
    else {
      if ((local_7ac != cCRNFileTypeDDS) || (0xfe < local_484)) goto LAB_001474b7;
      p_00 = "Clustered DDS compressor doesn\'t support DXT3";
    }
    console::warning(p_00);
  }
LAB_001474b7:
  iVar5 = (*p->_vptr_itexture_comp[4])(p,local_7b0,local_7c8);
  if ((char)iVar5 != '\0') {
    iVar5 = (*p->_vptr_itexture_comp[7])();
    puVar9 = (undefined8 *)CONCAT44(extraout_var_00,iVar5);
    puVar4 = local_7c0->m_p;
    local_7c0->m_p = (uchar *)*puVar9;
    *puVar9 = puVar4;
    uVar3 = local_7c0->m_size;
    local_7c0->m_size = *(uint *)(puVar9 + 1);
    *(uint *)(puVar9 + 1) = uVar3;
    uVar3 = local_7c0->m_capacity;
    local_7c0->m_capacity = *(uint *)((long)puVar9 + 0xc);
    *(uint *)((long)puVar9 + 0xc) = uVar3;
    if ((local_7d0 != (uint32 *)0x0) && (local_488 <= 0.0)) {
      *local_7d0 = local_484;
    }
    (**p->_vptr_itexture_comp)(p);
    crnlib_free(p);
    return true;
  }
  (**p->_vptr_itexture_comp)(p);
LAB_0014753c:
  crnlib_free(p);
  return false;
}

Assistant:

bool create_compressed_texture(const crn_comp_params& params, crnlib::vector<uint8>& comp_data, uint32* pActual_quality_level, float* pActual_bitrate)
    {
        crn_comp_params local_params(params);

        if (pixel_format_helpers::is_crn_format_non_srgb(local_params.m_format))
        {
            if (local_params.get_flag(cCRNCompFlagPerceptual))
            {
                console::info("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");

                // Destination compressed pixel format is swizzled or not RGB at all, so be sure perceptual colorspace metrics are disabled.
                local_params.set_flag(cCRNCompFlagPerceptual, false);
            }
        }

        if (pActual_quality_level)
        {
            *pActual_quality_level = 0;
        }
        if (pActual_bitrate)
        {
            *pActual_bitrate = 0.0f;
        }

        comp_data.resize(0);

        itexture_comp* pTexture_comp = create_texture_comp(local_params.m_file_type);
        if (!pTexture_comp)
        {
            return false;
        }

        if (!pTexture_comp->compress_init(local_params))
        {
            crnlib_delete(pTexture_comp);
            return false;
        }

        if ((local_params.m_target_bitrate <= 0.0f) || (local_params.m_format == cCRNFmtDXT3) || ((local_params.m_file_type == cCRNFileTypeCRN) && ((local_params.m_flags & cCRNCompFlagManualPaletteSizes) != 0)))
        {
            if ((local_params.m_file_type == cCRNFileTypeCRN) || ((local_params.m_file_type == cCRNFileTypeDDS) && (local_params.m_quality_level < cCRNMaxQualityLevel)))
            {
                console::info("Compressing using quality level %i", local_params.m_quality_level);
            }
            if (local_params.m_format == cCRNFmtDXT3)
            {
                if (local_params.m_file_type == cCRNFileTypeCRN)
                {
                    console::warning("CRN format doesn't support DXT3");
                }
                else if ((local_params.m_file_type == cCRNFileTypeDDS) && (local_params.m_quality_level < cCRNMaxQualityLevel))
                {
                    console::warning("Clustered DDS compressor doesn't support DXT3");
                }
            }
            if (!pTexture_comp->compress_pass(local_params, pActual_bitrate))
            {
                crnlib_delete(pTexture_comp);
                return false;
            }

            comp_data.swap(pTexture_comp->get_comp_data());

            if ((pActual_quality_level) && (local_params.m_target_bitrate <= 0.0))
            {
                *pActual_quality_level = local_params.m_quality_level;
            }

            crnlib_delete(pTexture_comp);
            return true;
        }

        // Interpolative search to find closest quality level to target bitrate.
        const int cLowestQuality = 0;
        const int cHighestQuality = cCRNMaxQualityLevel;
        const int cNumQualityLevels = cHighestQuality - cLowestQuality + 1;

        float best_bitrate = 1e+10f;
        int best_quality_level = -1;
        const uint cMaxIterations = 8;

        for (;;)
        {
            int low_quality = cLowestQuality;
            int high_quality = cHighestQuality;

            float cached_bitrates[cNumQualityLevels];
            for (int i = 0; i < cNumQualityLevels; i++)
            {
                cached_bitrates[i] = -1.0f;
            }

            float highest_bitrate = 0.0f;

            uint iter_count = 0;
            bool force_binary_search = false;

            while (low_quality <= high_quality)
            {
                if (params.m_flags & cCRNCompFlagDebugging)
                {
                    console::debug("Quality level bracket: [%u, %u]", low_quality, high_quality);
                }

                int trial_quality = (low_quality + high_quality) / 2;

                if ((iter_count) && (!force_binary_search))
                {
                    int bracket_low = trial_quality;
                    while ((cached_bitrates[bracket_low] < 0) && (bracket_low > cLowestQuality))
                    {
                        bracket_low--;
                    }

                    if (cached_bitrates[bracket_low] < 0)
                    {
                        trial_quality = static_cast<int>(math::lerp<float>((float)low_quality, (float)high_quality, .33f));
                    }
                    else
                    {
                        int bracket_high = trial_quality + 1;
                        if (bracket_high <= cHighestQuality)
                        {
                            while ((cached_bitrates[bracket_high] < 0) && (bracket_high < cHighestQuality))
                            {
                                bracket_high++;
                            }

                            if (cached_bitrates[bracket_high] >= 0)
                            {
                                float bracket_low_bitrate = cached_bitrates[bracket_low];
                                float bracket_high_bitrate = cached_bitrates[bracket_high];

                                if ((bracket_low_bitrate < bracket_high_bitrate) &&
                                    (bracket_low_bitrate < local_params.m_target_bitrate) &&
                                    (bracket_high_bitrate >= local_params.m_target_bitrate))
                                {
                                    int quality = low_quality + static_cast<int>(((local_params.m_target_bitrate - bracket_low_bitrate) * (high_quality - low_quality)) / (bracket_high_bitrate - bracket_low_bitrate));

                                    if ((quality >= low_quality) && (quality <= high_quality))
                                    {
                                        trial_quality = quality;
                                    }
                                }
                            }
                        }
                    }
                }

                console::info("Compressing to quality level %u", trial_quality);

                float bitrate = 0.0f;

                local_params.m_quality_level = trial_quality;

                if (!pTexture_comp->compress_pass(local_params, &bitrate))
                {
                    crnlib_delete(pTexture_comp);
                    return false;
                }

                cached_bitrates[trial_quality] = bitrate;

                highest_bitrate = math::maximum(highest_bitrate, bitrate);

                console::info("\nTried quality level %u, bpp: %3.3f", trial_quality, bitrate);

                if ((best_quality_level < 0) ||
                    ((bitrate <= local_params.m_target_bitrate) && (best_bitrate > local_params.m_target_bitrate)) ||
                    (((bitrate <= local_params.m_target_bitrate) || (best_bitrate > local_params.m_target_bitrate)) && (fabs(bitrate - local_params.m_target_bitrate) < fabs(best_bitrate - local_params.m_target_bitrate))))
                {
                    best_bitrate = bitrate;
                    comp_data.swap(pTexture_comp->get_comp_data());
                    best_quality_level = trial_quality;
                    if (params.m_flags & cCRNCompFlagDebugging)
                    {
                        console::debug("Choose new best quality level");
                    }

                    if ((best_bitrate <= local_params.m_target_bitrate) && (fabs(best_bitrate - local_params.m_target_bitrate) < .005f))
                    {
                        break;
                    }
                }

                if (bitrate > local_params.m_target_bitrate)
                {
                    high_quality = trial_quality - 1;
                }
                else
                {
                    low_quality = trial_quality + 1;
                }

                iter_count++;
                if (iter_count > cMaxIterations)
                {
                    force_binary_search = true;
                }
            }

            if (((local_params.m_flags & cCRNCompFlagHierarchical) != 0) &&
                (highest_bitrate < local_params.m_target_bitrate) &&
                (fabs(best_bitrate - local_params.m_target_bitrate) >= .005f))
            {
                console::info("Unable to achieve desired bitrate - disabling adaptive block sizes and retrying search.");

                local_params.m_flags &= ~cCRNCompFlagHierarchical;

                crnlib_delete(pTexture_comp);
                pTexture_comp = create_texture_comp(local_params.m_file_type);

                if (!pTexture_comp->compress_init(local_params))
                {
                    crnlib_delete(pTexture_comp);
                    return false;
                }
            }
            else
            {
                break;
            }
        }

        crnlib_delete(pTexture_comp);
        pTexture_comp = nullptr;

        if (best_quality_level < 0)
        {
            return false;
        }

        if (pActual_quality_level)
        {
            *pActual_quality_level = best_quality_level;
        }
        if (pActual_bitrate)
        {
            *pActual_bitrate = best_bitrate;
        }

        console::printf("Selected quality level %u bpp: %f", best_quality_level, best_bitrate);

        return true;
    }